

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O1

void bsClose(BitStream *bs)

{
  int iVar1;
  int iVar2;
  
  if (bs->mode == 'w') {
    if (bs->buffLive < 8) {
      iVar2 = bs->buffer;
      iVar1 = bs->buffLive + -8;
      do {
        iVar2 = iVar2 * 2;
        iVar1 = iVar1 + 1;
      } while (iVar1 != 0);
      bs->buffLive = 8;
      bs->buffer = iVar2;
    }
    iVar2 = putc((uint)(byte)bs->buffer,(FILE *)bs->handle);
    if (iVar2 == -1) goto LAB_00101c33;
    bytesOut = bytesOut + 1;
    iVar2 = fflush((FILE *)bs->handle);
    if (iVar2 == -1) goto LAB_00101c33;
  }
  iVar2 = fclose((FILE *)bs->handle);
  if (iVar2 != -1) {
    free(bs);
    return;
  }
  if (bs->mode != 'w') {
    readError();
  }
LAB_00101c33:
  writeError();
}

Assistant:

static void bsClose ( BitStream* bs )
{
   Int32 retVal;

   if ( bs->mode == 'w' ) {
      while ( bs->buffLive < 8 ) {
         bs->buffLive++;
         bs->buffer <<= 1;
      };
      retVal = putc ( (UChar) (bs->buffer), bs->handle );
      if (retVal == EOF) writeError();
      bytesOut++;
      retVal = fflush ( bs->handle );
      if (retVal == EOF) writeError();
   }
   retVal = fclose ( bs->handle );
   if (retVal == EOF) {
      if (bs->mode == 'w') writeError(); else readError();
   }
   free ( bs );
}